

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# module-utils.h
# Opt level: O2

void wasm::ModuleUtils::
     renameFunctions<std::map<wasm::Name,wasm::Name,std::less<wasm::Name>,std::allocator<std::pair<wasm::Name_const,wasm::Name>>>>
               (Module *wasm,
               map<wasm::Name,_wasm::Name,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>
               *map)

{
  _Base_ptr p_Var1;
  Function *pFVar2;
  Function *pFVar3;
  _Base_ptr p_Var4;
  undefined1 local_258 [8];
  PassRunner runner;
  Updater updater;
  
  p_Var4 = (map->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
  do {
    if ((_Rb_tree_header *)p_Var4 == &(map->_M_t)._M_impl.super__Rb_tree_header) {
      Module::updateMaps(wasm);
      updater.super_WalkerPass<wasm::PostWalker<Updater,_wasm::Visitor<Updater,_void>_>_>.super_Pass
      .runner = (PassRunner *)
                &updater.super_WalkerPass<wasm::PostWalker<Updater,_wasm::Visitor<Updater,_void>_>_>
                 .super_Pass.name._M_string_length;
      updater.super_WalkerPass<wasm::PostWalker<Updater,_wasm::Visitor<Updater,_void>_>_>.super_Pass
      ._vptr_Pass = (_func_int **)0x0;
      updater.super_WalkerPass<wasm::PostWalker<Updater,_wasm::Visitor<Updater,_void>_>_>.super_Pass
      .name._M_dataplus._M_p = (pointer)0x0;
      updater.super_WalkerPass<wasm::PostWalker<Updater,_wasm::Visitor<Updater,_void>_>_>.super_Pass
      .name._M_string_length._0_1_ = 0;
      updater.super_WalkerPass<wasm::PostWalker<Updater,_wasm::Visitor<Updater,_void>_>_>.super_Pass
      .name.field_2._8_8_ = 0;
      updater.super_WalkerPass<wasm::PostWalker<Updater,_wasm::Visitor<Updater,_void>_>_>.
      super_PostWalker<Updater,_wasm::Visitor<Updater,_void>_>.
      super_Walker<Updater,_wasm::Visitor<Updater,_void>_>.replacep = (Expression **)0x0;
      updater.super_WalkerPass<wasm::PostWalker<Updater,_wasm::Visitor<Updater,_void>_>_>.
      super_PostWalker<Updater,_wasm::Visitor<Updater,_void>_>.
      super_Walker<Updater,_wasm::Visitor<Updater,_void>_>.stack.fixed._M_elems[9].currp =
           (Expression **)0x0;
      updater.super_WalkerPass<wasm::PostWalker<Updater,_wasm::Visitor<Updater,_void>_>_>.
      super_PostWalker<Updater,_wasm::Visitor<Updater,_void>_>.
      super_Walker<Updater,_wasm::Visitor<Updater,_void>_>.stack.flexible.
      super__Vector_base<wasm::Walker<Updater,_wasm::Visitor<Updater,_void>_>::Task,_std::allocator<wasm::Walker<Updater,_wasm::Visitor<Updater,_void>_>::Task>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      updater.super_WalkerPass<wasm::PostWalker<Updater,_wasm::Visitor<Updater,_void>_>_>.
      super_PostWalker<Updater,_wasm::Visitor<Updater,_void>_>.
      super_Walker<Updater,_wasm::Visitor<Updater,_void>_>.stack.flexible.
      super__Vector_base<wasm::Walker<Updater,_wasm::Visitor<Updater,_void>_>::Task,_std::allocator<wasm::Walker<Updater,_wasm::Visitor<Updater,_void>_>::Task>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      updater.super_WalkerPass<wasm::PostWalker<Updater,_wasm::Visitor<Updater,_void>_>_>.
      super_PostWalker<Updater,_wasm::Visitor<Updater,_void>_>.
      super_Walker<Updater,_wasm::Visitor<Updater,_void>_>.stack.flexible.
      super__Vector_base<wasm::Walker<Updater,_wasm::Visitor<Updater,_void>_>::Task,_std::allocator<wasm::Walker<Updater,_wasm::Visitor<Updater,_void>_>::Task>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      updater.super_WalkerPass<wasm::PostWalker<Updater,_wasm::Visitor<Updater,_void>_>_>.
      super_PostWalker<Updater,_wasm::Visitor<Updater,_void>_>.
      super_Walker<Updater,_wasm::Visitor<Updater,_void>_>.currFunction = (Function *)0x0;
      runner.skippedPasses._M_h._M_single_bucket = (__node_base_ptr)&PTR__WalkerPass_00e1d860;
      updater.super_WalkerPass<wasm::PostWalker<Updater,_wasm::Visitor<Updater,_void>_>_>.
      super_PostWalker<Updater,_wasm::Visitor<Updater,_void>_>.
      super_Walker<Updater,_wasm::Visitor<Updater,_void>_>.currModule = (Module *)map;
      renameFunctions<std::map<wasm::Name,wasm::Name,std::less<wasm::Name>,std::allocator<std::
      pair<wasm::Name_const,wasm::Name>>>>(wasm::Module&,std::map<wasm::Name,wasm::Name,std::
      less<wasm::Name>,std::allocator<std::pair<wasm::Name_const,wasm::Name>>>&)::Updater::
      maybeUpdate(wasm::Name__(&runner.skippedPasses._M_h._M_single_bucket,&wasm->start);
      PassRunner::PassRunner((PassRunner *)local_258,wasm);
      WalkerPass<wasm::PostWalker<Updater,_wasm::Visitor<Updater,_void>_>_>::run
                ((WalkerPass<wasm::PostWalker<Updater,_wasm::Visitor<Updater,_void>_>_> *)
                 &runner.skippedPasses._M_h._M_single_bucket,(PassRunner *)local_258,wasm);
      WalkerPass<wasm::PostWalker<Updater,_wasm::Visitor<Updater,_void>_>_>::runOnModuleCode
                ((WalkerPass<wasm::PostWalker<Updater,_wasm::Visitor<Updater,_void>_>_> *)
                 &runner.skippedPasses._M_h._M_single_bucket,(PassRunner *)local_258,wasm);
      PassRunner::~PassRunner((PassRunner *)local_258);
      WalkerPass<wasm::PostWalker<Updater,_wasm::Visitor<Updater,_void>_>_>::~WalkerPass
                ((WalkerPass<wasm::PostWalker<Updater,_wasm::Visitor<Updater,_void>_>_> *)
                 &runner.skippedPasses._M_h._M_single_bucket);
      return;
    }
    pFVar2 = Module::getFunctionOrNull(wasm,(Name)*(string_view *)(p_Var4 + 1));
    if (pFVar2 != (Function *)0x0) {
      pFVar3 = Module::getFunctionOrNull(wasm,(IString)*(IString *)&p_Var4[1]._M_left);
      if ((pFVar3 != (Function *)0x0) &&
         ((_Base_ptr)(pFVar2->super_Importable).super_Named.name.super_IString.str._M_str !=
          p_Var4[1]._M_right)) {
        __assert_fail("!wasm.getFunctionOrNull(newName) || func->name == newName",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/ir/module-utils.h"
                      ,0xb8,
                      "void wasm::ModuleUtils::renameFunctions(Module &, T &) [T = std::map<wasm::Name, wasm::Name>]"
                     );
      }
      p_Var1 = p_Var4[1]._M_right;
      (pFVar2->super_Importable).super_Named.name.super_IString.str._M_len =
           (size_t)p_Var4[1]._M_left;
      (pFVar2->super_Importable).super_Named.name.super_IString.str._M_str = (char *)p_Var1;
    }
    p_Var4 = (_Base_ptr)std::_Rb_tree_increment(p_Var4);
  } while( true );
}

Assistant:

inline void renameFunctions(Module& wasm, T& map) {
  // Update the function itself.
  for (auto& [oldName, newName] : map) {
    if (Function* func = wasm.getFunctionOrNull(oldName)) {
      assert(!wasm.getFunctionOrNull(newName) || func->name == newName);
      func->name = newName;
    }
  }
  wasm.updateMaps();

  // Update all references to it.
  struct Updater : public WalkerPass<PostWalker<Updater>> {
    bool isFunctionParallel() override { return true; }

    T& map;

    void maybeUpdate(Name& name) {
      if (auto iter = map.find(name); iter != map.end()) {
        name = iter->second;
      }
    }

    Updater(T& map) : map(map) {}

    std::unique_ptr<Pass> create() override {
      return std::make_unique<Updater>(map);
    }

    void visitCall(Call* curr) { maybeUpdate(curr->target); }

    void visitRefFunc(RefFunc* curr) { maybeUpdate(curr->func); }
  };

  Updater updater(map);
  updater.maybeUpdate(wasm.start);
  PassRunner runner(&wasm);
  updater.run(&runner, &wasm);
  updater.runOnModuleCode(&runner, &wasm);
}